

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags flags)

{
  ImVec2 IVar1;
  ImGuiWindow *this;
  ImGuiContext *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiID id;
  ImGuiViewportP *pIVar5;
  float fVar6;
  float fVar7;
  ImVec2 IVar8;
  
  pIVar2 = GImGui;
  this = GImGui->CurrentWindow;
  id = ImGuiWindow::GetID(this,name,(char *)0x0);
  bVar4 = IsPopupOpen(id,0);
  if (bVar4) {
    if (((pIVar2->NextWindowData).Flags & 1) == 0) {
      if (this->WasActive == true) {
        pIVar5 = this->Viewport;
      }
      else {
        pIVar5 = (ImGuiViewportP *)GetMainViewport();
      }
      pIVar3 = GImGui;
      IVar8 = (pIVar5->super_ImGuiViewport).Pos;
      IVar1 = (pIVar5->super_ImGuiViewport).Size;
      fVar6 = IVar8.x;
      fVar7 = IVar8.y;
      IVar8.x = (IVar1.x + fVar6 + fVar6) * 0.5;
      IVar8.y = (IVar1.y + fVar7 + fVar7) * 0.5;
      (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
      (pIVar3->NextWindowData).PosVal = IVar8;
      (pIVar3->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar3->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar3->NextWindowData).PosCond = 4;
      (pIVar3->NextWindowData).PosUndock = true;
    }
    bVar4 = Begin(name,p_open,flags | 0xc200020);
    if (bVar4) {
      if (p_open == (bool *)0x0) {
        return true;
      }
      if (*p_open != false) {
        return true;
      }
      EndPopup();
      ClosePopupToLevel((pIVar2->BeginPopupStack).Size,true);
    }
    else {
      EndPopup();
    }
  }
  else {
    (pIVar2->NextWindowData).Flags = 0;
  }
  return false;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }

    // Center modal windows by default for increased visibility
    // (this won't really last as settings will kick in, and is mostly for backward compatibility. user may do the same themselves)
    // FIXME: Should test for (PosCond & window->SetWindowPosAllowFlags) with the upcoming window.
    if ((g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) == 0)
    {
        ImGuiViewportP* viewport = window->WasActive ? window->Viewport : (ImGuiViewportP*)GetMainViewport(); // FIXME-VIEWPORT: What may be our reference viewport?
        SetNextWindowPos(viewport->GetMainRect().GetCenter(), ImGuiCond_FirstUseEver, ImVec2(0.5f, 0.5f));
    }

    flags |= ImGuiWindowFlags_Popup | ImGuiWindowFlags_Modal | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoDocking;
    const bool is_open = Begin(name, p_open, flags);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        EndPopup();
        if (is_open)
            ClosePopupToLevel(g.BeginPopupStack.Size, true);
        return false;
    }
    return is_open;
}